

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_msg_trim_u64(nng_msg *m,uint64_t *vp)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  size_t sVar10;
  byte *pbVar11;
  
  sVar10 = nni_msg_len(m);
  iVar9 = 3;
  if (7 < sVar10) {
    pbVar11 = (byte *)nni_msg_body(m);
    bVar1 = *pbVar11;
    bVar2 = pbVar11[1];
    bVar3 = pbVar11[2];
    bVar4 = pbVar11[3];
    bVar5 = pbVar11[4];
    bVar6 = pbVar11[5];
    bVar7 = pbVar11[6];
    bVar8 = pbVar11[7];
    nni_msg_trim(m,8);
    *vp = (ulong)bVar8 +
          ((ulong)bVar7 << 8 |
          (ulong)bVar6 << 0x10 |
          (ulong)bVar5 << 0x18 |
          (ulong)bVar4 << 0x20 | (ulong)bVar3 << 0x28 | (ulong)bVar2 << 0x30 | (ulong)bVar1 << 0x38)
    ;
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int
nng_msg_trim_u64(nng_msg *m, uint64_t *vp)
{
	uint8_t *body;
	uint64_t v;
	if (nni_msg_len(m) < sizeof(v)) {
		return (NNG_EINVAL);
	}
	body = nni_msg_body(m);
	NNI_GET64(body, v);
	(void) nni_msg_trim(m, sizeof(v));
	*vp = v;
	return (0);
}